

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtnm(fitsfile *gfptr,long *nmembers,int *status)

{
  int iVar1;
  char local_c8 [8];
  char comment [73];
  char keyvalue [71];
  int *status_local;
  long *nmembers_local;
  fitsfile *gfptr_local;
  
  if (*status == 0) {
    iVar1 = ffgkey(gfptr,"EXTNAME",comment + 0x48,local_c8,status);
    *status = iVar1;
    if (*status == 0xca) {
      *status = 0x154;
    }
    else {
      prepare_keyvalue(comment + 0x48);
      iVar1 = fits_strcasecmp(comment + 0x48,"GROUPING");
      if (iVar1 != 0) {
        *status = 0x154;
        ffpmsg("Specified HDU is not a Grouping table (ffgtnm)");
      }
      iVar1 = ffgkyj(gfptr,"NAXIS2",nmembers,local_c8,status);
      *status = iVar1;
    }
    gfptr_local._4_4_ = *status;
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgtnm(fitsfile *gfptr,    /* FITS file pointer to grouping table        */
	   long     *nmembers, /* member count  of the groping table         */
	   int      *status)   /* return status code                         */

/*
  return the number of member HDUs in a grouping table. The fitsfile pointer
  gfptr must be positioned with the grouping table as the CHDU. The number
  of grouping table member HDUs is just the NAXIS2 value of the grouping
  table.
*/

{
  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  

  if(*status != 0) return(*status);

  *status = fits_read_keyword(gfptr,"EXTNAME",keyvalue,comment,status);
  
  if(*status == KEY_NO_EXIST)
    *status = NOT_GROUP_TABLE;
  else
    {
      prepare_keyvalue(keyvalue);

      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
	{
	  *status = NOT_GROUP_TABLE;
	  ffpmsg("Specified HDU is not a Grouping table (ffgtnm)");
	}

      *status = fits_read_key_lng(gfptr,"NAXIS2",nmembers,comment,status);
    }

  return(*status);
}